

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::SSARewriter::GetReplacement(SSARewriter *this,pair<unsigned_int,_unsigned_int> repl)

{
  uint uVar1;
  __buckets_ptr pp_Var2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  uVar6 = (ulong)repl >> 0x20;
  pp_Var2 = (this->load_replacement_)._M_h._M_buckets;
  uVar3 = (this->load_replacement_)._M_h._M_bucket_count;
  p_Var7 = pp_Var2[uVar6 % uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if (p_Var7 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var7->_M_nxt;
    p_Var5 = p_Var7;
    if (*(uint *)&p_Var7->_M_nxt[1]._M_nxt != repl.second) {
      while (p_Var7 = p_Var4, p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar3 != uVar6 % uVar3) ||
           (p_Var5 = p_Var7, *(uint *)&p_Var4[1]._M_nxt == repl.second)) goto LAB_00504d4e;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
  }
LAB_00504d4e:
  if (p_Var5 == (__node_base_ptr)0x0) goto LAB_00504d58;
  p_Var4 = p_Var5->_M_nxt;
  do {
    if (p_Var4 == (_Hash_node_base *)0x0) {
      return (uint32_t)uVar6;
    }
    uVar1 = *(uint *)((long)&p_Var4[1]._M_nxt + 4);
    uVar6 = (ulong)uVar1;
    p_Var7 = pp_Var2[uVar6 % uVar3];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var7, p_Var8 = p_Var7->_M_nxt, uVar1 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
      while (p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar3 != uVar6 % uVar3) ||
           (p_Var5 = p_Var8, p_Var8 = p_Var4, uVar1 == *(uint *)&p_Var4[1]._M_nxt))
        goto LAB_00504db8;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_00504db8:
    if (p_Var5 == (__node_base_ptr)0x0) {
LAB_00504d58:
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var5->_M_nxt;
    }
  } while( true );
}

Assistant:

uint32_t SSARewriter::GetReplacement(std::pair<uint32_t, uint32_t> repl) {
  uint32_t val_id = repl.second;
  auto it = load_replacement_.find(val_id);
  while (it != load_replacement_.end()) {
    val_id = it->second;
    it = load_replacement_.find(val_id);
  }
  return val_id;
}